

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitAig.c
# Opt level: O3

Aig_Obj_t * Kit_GraphToAig(Aig_Man_t *pMan,Aig_Obj_t **pFanins,Kit_Graph_t *pGraph)

{
  long lVar1;
  Aig_Obj_t *pAVar2;
  long lVar3;
  
  if (0 < pGraph->nLeaves) {
    lVar1 = 1;
    lVar3 = 0;
    do {
      *(Aig_Obj_t **)(&pGraph->pNodes->eEdge0 + lVar1 * 2) = pFanins[lVar3];
      lVar3 = lVar3 + 1;
      lVar1 = lVar1 + 3;
    } while (lVar3 < pGraph->nLeaves);
  }
  pAVar2 = Kit_GraphToAigInternal(pMan,pGraph);
  return pAVar2;
}

Assistant:

Aig_Obj_t * Kit_GraphToAig( Aig_Man_t * pMan, Aig_Obj_t ** pFanins, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL;
    int i;
    // collect the fanins
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = pFanins[i];
    // perform strashing
    return Kit_GraphToAigInternal( pMan, pGraph );
}